

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void slang::ast::createUninstantiatedDef<slang::syntax::HierarchyInstantiationSyntax>
               (Compilation *compilation,HierarchyInstantiationSyntax *syntax,
               HierarchicalInstanceSyntax *instanceSyntax,string_view moduleName,ASTContext *context
               ,span<const_slang::ast::Expression_*const,_18446744073709551615UL> params,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *implicitNetNames,NetType *netType)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  UninstantiatedDefSymbol *this;
  UninstantiatedDefSymbol *local_60;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = moduleName._M_str;
  local_40._M_len = moduleName._M_len;
  anon_unknown.dwarf_678911::createImplicitNets
            (instanceSyntax,context,netType,(bitmask<slang::ast::InstanceFlags>)0x0,implicitNetNames
             ,implicitNets);
  anon_unknown.dwarf_678911::getNameLoc(&local_58,instanceSyntax);
  this = BumpAllocator::
         emplace<slang::ast::UninstantiatedDefSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::basic_string_view<char,std::char_traits<char>>&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
                   (&compilation->super_BumpAllocator,&local_58.first,&local_58.second,&local_40,
                    &params);
  (this->super_Symbol).originatingSyntax = &instanceSyntax->super_SyntaxNode;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,(context->scope).ptr,syntax_00);
  local_60 = this;
  SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
            ((SmallVectorBase<slang::ast::Symbol_const*> *)results,(Symbol **)&local_60);
  return;
}

Assistant:

static void createUninstantiatedDef(Compilation& compilation, const TSyntax& syntax,
                                    const HierarchicalInstanceSyntax* instanceSyntax,
                                    std::string_view moduleName, const ASTContext& context,
                                    std::span<const Expression* const> params,
                                    SmallVectorBase<const Symbol*>& results,
                                    SmallVectorBase<const Symbol*>& implicitNets,
                                    SmallSet<std::string_view, 8>& implicitNetNames,
                                    const NetType& netType) {
    createImplicitNets(*instanceSyntax, context, netType, InstanceFlags::None, implicitNetNames,
                       implicitNets);

    auto [name, loc] = getNameLoc(*instanceSyntax);
    auto sym = compilation.emplace<UninstantiatedDefSymbol>(name, loc, moduleName, params);
    sym->setSyntax(*instanceSyntax);
    sym->setAttributes(*context.scope, syntax.attributes);
    results.push_back(sym);
}